

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O2

void __thiscall Pose::setrot(Pose *this,double RX,double RY,double RZ)

{
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double w;
  double z;
  double y;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_28;
  
  dVar2 = cos(RZ * 0.5);
  dVar3 = sin(RZ * 0.5);
  dVar4 = cos(RY * 0.5);
  dVar5 = sin(RY * 0.5);
  dVar6 = cos(RX * 0.5);
  dVar7 = sin(RX * 0.5);
  y = dVar5 * dVar6 * dVar2 + dVar3 * dVar4 * dVar7;
  z = dVar4 * dVar6 * dVar3 - dVar2 * dVar5 * dVar7;
  w = dVar4 * dVar6 * dVar2 + dVar5 * dVar7 * dVar3;
  local_28.m_xpr = &this->rot;
  local_28.m_row = 0;
  local_28.m_col = 1;
  local_28.m_currentBlockRows = 1;
  (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = dVar4 * dVar7 * dVar2 - dVar3 * dVar5 * dVar6;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(&local_28,&y);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar1,&z);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar1,&w);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished(&local_28);
  return;
}

Assistant:

void Pose::setrot(double RX, double RY, double RZ){
      double x, y, z, w;
      // Abbreviations for the various angular functions
      double cy = cos(RZ * 0.5);
      double sy = sin(RZ * 0.5);
      double cp = cos(RY * 0.5);
      double sp = sin(RY * 0.5);
      double cr = cos(RX * 0.5);
      double sr = sin(RX * 0.5);

      x = sr * cp * cy - cr * sp * sy;
      y = cr * sp * cy + sr * cp * sy;
      z = cr * cp * sy - sr * sp * cy;
      w = cr * cp * cy + sr * sp * sy;

      this->rot << x, y, z, w;
}